

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O2

void __thiscall
cmCTestVC::WriteXMLEntry
          (cmCTestVC *this,cmXMLWriter *xml,string *path,string *name,string *full,File *f)

{
  Revision *value;
  string prior;
  allocator local_79;
  string local_78;
  cmCTestVC *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  value = &this->Unknown;
  if (f->Rev != (Revision *)0x0) {
    value = f->Rev;
  }
  local_58 = this;
  if (f->PriorRev == (Revision *)0x0) {
    std::__cxx11::string::string((string *)&local_50,"Unknown",(allocator *)&local_78);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)f->PriorRev);
  }
  std::__cxx11::string::string
            ((string *)&local_78,
             _ZZN9cmCTestVC13WriteXMLEntryER11cmXMLWriterRKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEES9_S9_RKNS_4FileEE4desc_rel
             + *(int *)(
                       _ZZN9cmCTestVC13WriteXMLEntryER11cmXMLWriterRKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEES9_S9_RKNS_4FileEE4desc_rel
                       + (ulong)f->Status * 4),&local_79);
  cmXMLWriter::StartElement(xml,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"File",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,name);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"Directory",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,path);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"FullName",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,full);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"CheckinDate",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&value->Date);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"Author",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&value->Author);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"Email",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&value->EMail);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"Committer",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&value->Committer);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"CommitterEmail",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&value->CommitterEMail);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"CommitDate",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&value->CommitDate);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"Log",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&value->Log);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"Revision",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&value->Rev);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string((string *)&local_78,"PriorRevision",&local_79);
  cmXMLWriter::Element<std::__cxx11::string>(xml,&local_78,&local_50);
  std::__cxx11::string::~string((string *)&local_78);
  cmXMLWriter::EndElement(xml);
  local_58->PathCount[f->Status] = local_58->PathCount[f->Status] + 1;
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmCTestVC::WriteXMLEntry(cmXMLWriter& xml,
                              std::string const& path,
                              std::string const& name,
                              std::string const& full,
                              File const& f)
{
  static const char* desc[3] = { "Updated", "Modified", "Conflicting"};
  Revision const& rev = f.Rev? *f.Rev : this->Unknown;
  std::string prior = f.PriorRev? f.PriorRev->Rev : std::string("Unknown");
  xml.StartElement(desc[f.Status]);
  xml.Element("File", name);
  xml.Element("Directory", path);
  xml.Element("FullName", full);
  xml.Element("CheckinDate", rev.Date);
  xml.Element("Author", rev.Author);
  xml.Element("Email", rev.EMail);
  xml.Element("Committer", rev.Committer);
  xml.Element("CommitterEmail", rev.CommitterEMail);
  xml.Element("CommitDate", rev.CommitDate);
  xml.Element("Log", rev.Log);
  xml.Element("Revision", rev.Rev);
  xml.Element("PriorRevision", prior);
  xml.EndElement();
  ++this->PathCount[f.Status];
}